

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

void record_render_passes2(StateRecorder *recorder)

{
  uint32_t *puVar1;
  bool bVar2;
  int iVar3;
  VkRenderPass_T *pVVar4;
  undefined8 local_2f8;
  VkRenderPassCreationControlEXT creation_control;
  VkMemoryBarrier2KHR memory_barrier2;
  VkMultisampledRenderToSingleSampledInfoEXT ms2ss;
  VkFragmentShadingRateAttachmentInfoKHR shading_rate_info;
  VkSubpassDescriptionDepthStencilResolve ds_resolve;
  VkAttachmentReference2 ds_resolve_ref;
  VkAttachmentReferenceStencilLayout attachment_ref_stencil_layout;
  VkAttachmentDescriptionStencilLayoutKHR attachment_desc_stencil_layout;
  VkAttachmentReference2 attachment_ref_shading_rate;
  VkAttachmentDescription2 att [2];
  VkSubpassDescription2 subpasses [2];
  VkSubpassDependency2 deps [2];
  undefined1 local_60 [8];
  VkRenderPassCreateInfo2 pass;
  StateRecorder *recorder_local;
  
  pass.pCorrelatedViewMasks = (uint32_t *)recorder;
  memset(local_60,0,0x50);
  local_60._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2;
  memset(&subpasses[1].pPreserveAttachments,0,0x60);
  memset(&att[1].finalLayout,0,0xb0);
  memset(&attachment_ref_shading_rate.aspectMask,0,0x70);
  attachment_desc_stencil_layout.stencilInitialLayout = 0x3b9c73c9;
  attachment_desc_stencil_layout.stencilFinalLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  attachment_ref_shading_rate.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  attachment_ref_shading_rate._4_4_ = 0;
  attachment_ref_shading_rate.pNext = (void *)0x3b9d4aa300000004;
  attachment_ref_shading_rate.attachment = 0;
  attachment_ref_shading_rate.layout = VK_IMAGE_LAYOUT_UNDEFINED;
  attachment_ref_stencil_layout.stencilLayout = VK_IMAGE_LAYOUT_STENCIL_ATTACHMENT_OPTIMAL;
  attachment_ref_stencil_layout._20_4_ = 0;
  attachment_desc_stencil_layout.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  attachment_desc_stencil_layout._4_4_ = 0;
  attachment_desc_stencil_layout.pNext = (void *)0x3b9e776a00000000;
  ds_resolve_ref.aspectMask = 0x3b9e7769;
  ds_resolve_ref._28_4_ = 0;
  attachment_ref_stencil_layout.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  attachment_ref_stencil_layout._4_4_ = 0;
  attachment_ref_stencil_layout.pNext = (void *)0x3b9e776a;
  ds_resolve.pDepthStencilResolveAttachment._0_4_ = 0x3b9c73c9;
  ds_resolve_ref._0_8_ = &ds_resolve_ref.aspectMask;
  ds_resolve_ref.pNext._0_4_ = 3;
  ds_resolve_ref.pNext._4_4_ = 0x3b9e7768;
  ds_resolve_ref.attachment = 0;
  shading_rate_info.shadingRateAttachmentTexelSize.width = 0x3b9dd359;
  shading_rate_info.shadingRateAttachmentTexelSize.height = 0;
  ds_resolve.pNext = (void *)0x400000008;
  ds_resolve._16_8_ = &ds_resolve.pDepthStencilResolveAttachment;
  ms2ss.multisampledRenderToSingleSampledEnable = 0x3b9e3cd0;
  ms2ss.rasterizationSamples = 0;
  shading_rate_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shading_rate_info._4_4_ = 0;
  shading_rate_info.pNext = &attachment_desc_stencil_layout.stencilInitialLayout;
  shading_rate_info.pFragmentShadingRateAttachment = (VkAttachmentReference2 *)0x1000000008;
  ds_resolve._0_8_ = &ms2ss.multisampledRenderToSingleSampledEnable;
  pass.pDependencies._0_4_ = 3;
  pass._64_8_ = record_render_passes2::correlated_view_masks;
  pass.pNext._0_4_ = 10;
  pass.pNext._4_4_ = 2;
  pass._16_8_ = &attachment_ref_shading_rate.aspectMask;
  pass.pSubpasses._0_4_ = 2;
  pass._48_8_ = &subpasses[1].pPreserveAttachments;
  pass.pAttachments._0_4_ = 2;
  pass._32_8_ = &att[1].finalLayout;
  subpasses[1].pPreserveAttachments._0_4_ = 0x3b9c73cb;
  attachment_ref_shading_rate.aspectMask = 0x3b9c73c8;
  att[0].pNext._0_4_ = 0x28;
  att[0].pNext._4_4_ = 0x53;
  att[0].stencilStoreOp = 2;
  att[0].stencilLoadOp = 7;
  att[0].format = VK_FORMAT_UNDEFINED;
  att[0].samples = 0;
  att[0].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  att[0].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  att[0].flags = 0x10;
  memcpy(&att[0].finalLayout,&attachment_ref_shading_rate.aspectMask,0x38);
  att[1].pNext._4_4_ = 0x82;
  att[1]._0_8_ = &attachment_ref_stencil_layout.stencilLayout;
  if (record_render_passes2(Fossilize::StateRecorder&)::ds == '\0') {
    iVar3 = __cxa_guard_acquire(&record_render_passes2(Fossilize::StateRecorder&)::ds);
    if (iVar3 != 0) {
      record_render_passes2::ds.sType = VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2;
      record_render_passes2::ds.pNext = &ds_resolve_ref.aspectMask;
      record_render_passes2::ds.attachment = 0;
      record_render_passes2::ds.layout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
      record_render_passes2::ds.aspectMask = 0x28;
      __cxa_guard_release(&record_render_passes2(Fossilize::StateRecorder&)::ds);
    }
  }
  puVar1 = pass.pCorrelatedViewMasks;
  att[1].finalLayout = 0x3b9c73ca;
  subpasses[0].pDepthStencilAttachment._0_4_ = 4;
  subpasses[0]._72_8_ = record_render_passes2::preserves;
  subpasses[0].pipelineBindPoint = 2;
  subpasses[0]._24_8_ = record_render_passes2::inputs;
  subpasses[0].pInputAttachments._0_4_ = 2;
  subpasses[0]._40_8_ = record_render_passes2::colors;
  subpasses[0].pNext._4_4_ = 1;
  subpasses[0].pResolveAttachments = &record_render_passes2::ds;
  subpasses[0].pColorAttachments = record_render_passes2::resolves;
  subpasses[0].flags = 0xf;
  subpasses[0].pPreserveAttachments._0_4_ = 0x3b9c73ca;
  subpasses[1].pipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
  subpasses[1]._24_8_ = record_render_passes2::inputs;
  subpasses[1].pInputAttachments._0_4_ = 2;
  subpasses[1]._40_8_ = record_render_passes2::colors;
  subpasses[1].pNext._4_4_ = 0;
  subpasses[1].flags = 7;
  subpasses[1]._0_8_ = &shading_rate_info.shadingRateAttachmentTexelSize;
  memory_barrier2.dstAccessMask = 0x3ba086c2;
  ms2ss.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  ms2ss._4_4_ = 0;
  ms2ss.pNext = (void *)0x400000001;
  pVVar4 = fake_handle<VkRenderPass_T*>(40000);
  bVar2 = Fossilize::StateRecorder::record_render_pass2
                    ((StateRecorder *)puVar1,pVVar4,(VkRenderPassCreateInfo2 *)local_60,0);
  puVar1 = pass.pCorrelatedViewMasks;
  if (!bVar2) {
    abort();
  }
  subpasses[0]._0_8_ = &memory_barrier2.dstAccessMask;
  pVVar4 = fake_handle<VkRenderPass_T*>(0x9c42);
  bVar2 = Fossilize::StateRecorder::record_render_pass2
                    ((StateRecorder *)puVar1,pVVar4,(VkRenderPassCreateInfo2 *)local_60,0);
  if (!bVar2) {
    abort();
  }
  memset(&creation_control.disallowMerging,0,0x30);
  puVar1 = pass.pCorrelatedViewMasks;
  creation_control.disallowMerging = 0x3b9f9490;
  memory_barrier2.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  memory_barrier2._4_4_ = 0;
  memory_barrier2.pNext = (void *)0xa00000000;
  memory_barrier2.srcStageMask = 0x22;
  memory_barrier2.srcAccessMask = 0xc700000000;
  memory_barrier2.dstStageMask = 0x31;
  pVVar4 = fake_handle<VkRenderPass_T*>(0x9c41);
  bVar2 = Fossilize::StateRecorder::record_render_pass2
                    ((StateRecorder *)puVar1,pVVar4,(VkRenderPassCreateInfo2 *)local_60,0);
  puVar1 = pass.pCorrelatedViewMasks;
  if (!bVar2) {
    abort();
  }
  local_2f8 = 0x3ba1c711;
  creation_control.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  creation_control._4_4_ = 0;
  creation_control.pNext = (void *)0x1;
  pass._0_8_ = &local_2f8;
  pVVar4 = fake_handle<VkRenderPass_T*>(0x9c42);
  bVar2 = Fossilize::StateRecorder::record_render_pass2
                    ((StateRecorder *)puVar1,pVVar4,(VkRenderPassCreateInfo2 *)local_60,0);
  if (!bVar2) {
    abort();
  }
  return;
}

Assistant:

static void record_render_passes2(StateRecorder &recorder)
{
	VkRenderPassCreateInfo2 pass = { VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2 };

	VkSubpassDependency2 deps[2] = {};
	VkSubpassDescription2 subpasses[2] = {};
	VkAttachmentDescription2 att[2] = {};

	const VkAttachmentReference2 attachment_ref_shading_rate = {
		VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr,
		4, VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR, 0
	};

	VkAttachmentDescriptionStencilLayoutKHR attachment_desc_stencil_layout =
			{ VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT };
	attachment_desc_stencil_layout.stencilInitialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
	attachment_desc_stencil_layout.stencilFinalLayout = VK_IMAGE_LAYOUT_STENCIL_ATTACHMENT_OPTIMAL;

	VkAttachmentReferenceStencilLayout attachment_ref_stencil_layout =
			{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT };
	attachment_ref_stencil_layout.stencilLayout = VK_IMAGE_LAYOUT_STENCIL_ATTACHMENT_OPTIMAL;

	const VkAttachmentReference2 ds_resolve_ref = {
		VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, &attachment_ref_stencil_layout,
		3, VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_OPTIMAL, 0,
	};

	VkSubpassDescriptionDepthStencilResolve ds_resolve =
			{ VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE };
	ds_resolve.depthResolveMode = VK_RESOLVE_MODE_MAX_BIT;
	ds_resolve.stencilResolveMode = VK_RESOLVE_MODE_MIN_BIT;
	ds_resolve.pDepthStencilResolveAttachment = &ds_resolve_ref;

	VkFragmentShadingRateAttachmentInfoKHR shading_rate_info =
			{ VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR };
	shading_rate_info.pFragmentShadingRateAttachment = &attachment_ref_shading_rate;
	shading_rate_info.shadingRateAttachmentTexelSize.width = 8;
	shading_rate_info.shadingRateAttachmentTexelSize.height = 16;
	ds_resolve.pNext = &shading_rate_info;

	static const uint32_t correlated_view_masks[] = { 1, 4, 2 };
	pass.correlatedViewMaskCount = 3;
	pass.pCorrelatedViewMasks = correlated_view_masks;

	pass.flags = 10;
	pass.attachmentCount = 2;
	pass.pAttachments = att;
	pass.dependencyCount = 2;
	pass.pDependencies = deps;
	pass.subpassCount = 2;
	pass.pSubpasses = subpasses;

	deps[0].sType = VK_STRUCTURE_TYPE_SUBPASS_DEPENDENCY_2;
	deps[0].dependencyFlags = VK_DEPENDENCY_BY_REGION_BIT;
	deps[0].dstAccessMask = 49;
	deps[0].srcAccessMask = 34;
	deps[0].dstStageMask = 199;
	deps[0].srcStageMask = 10;
	deps[0].srcSubpass = 9;
	deps[0].dstSubpass = 19;
	deps[0].viewOffset = -4;
	deps[1].dependencyFlags = 19;
	deps[1].dstAccessMask = 490;
	deps[1].srcAccessMask = 340;
	deps[1].dstStageMask = 1990;
	deps[1].srcStageMask = 100;
	deps[1].srcSubpass = 90;
	deps[1].dstSubpass = 190;
	deps[1].viewOffset = 6;

	att[0].sType = VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_2;
	att[0].flags = 40;
	att[0].format = VK_FORMAT_R16G16_SFLOAT;
	att[0].finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
	att[0].initialLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
	att[0].loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
	att[0].storeOp = VK_ATTACHMENT_STORE_OP_STORE;
	att[0].stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
	att[0].stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
	att[0].samples = VK_SAMPLE_COUNT_16_BIT;

	att[1] = att[0];
	att[1].format = VK_FORMAT_D32_SFLOAT_S8_UINT;
	att[1].pNext = &attachment_desc_stencil_layout;

	static const uint32_t preserves[4] = { 9, 4, 2, 3 };
	static const VkAttachmentReference2 inputs[2] = {
		{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr, 3, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL, 5 },
		{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr, 9, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, 6 }
	};
	static const VkAttachmentReference2 colors[2] = {
		{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr, 8, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL, 10 },
		{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr, 1, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, 13 }
	};
	static const VkAttachmentReference2 resolves[2] = {
		{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr, 1, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL, 20 },
		{ VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, nullptr, 3, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, 30 }
	};
	static const VkAttachmentReference2 ds = {
		VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_2, &attachment_ref_stencil_layout, 0, VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL, 40
	};
	subpasses[0].sType = VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_2;
	subpasses[0].preserveAttachmentCount = 4;
	subpasses[0].pPreserveAttachments = preserves;
	subpasses[0].inputAttachmentCount = 2;
	subpasses[0].pInputAttachments = inputs;
	subpasses[0].colorAttachmentCount = 2;
	subpasses[0].pColorAttachments = colors;
	subpasses[0].pipelineBindPoint = VK_PIPELINE_BIND_POINT_COMPUTE;
	subpasses[0].pDepthStencilAttachment = &ds;
	subpasses[0].pResolveAttachments = resolves;
	subpasses[0].viewMask = 0xf;

	subpasses[1].sType = VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_2;
	subpasses[1].inputAttachmentCount = 1;
	subpasses[1].pInputAttachments = inputs;
	subpasses[1].colorAttachmentCount = 2;
	subpasses[1].pColorAttachments = colors;
	subpasses[1].pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
	subpasses[1].viewMask = 0x7;
	subpasses[1].pNext = &ds_resolve;

	VkMultisampledRenderToSingleSampledInfoEXT ms2ss =
			{ VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT };
	ms2ss.rasterizationSamples = VK_SAMPLE_COUNT_4_BIT;
	ms2ss.multisampledRenderToSingleSampledEnable = VK_TRUE;

	if (!recorder.record_render_pass2(fake_handle<VkRenderPass>(40000), pass))
		abort();

	subpasses[0].pNext = &ms2ss;
	if (!recorder.record_render_pass2(fake_handle<VkRenderPass>(40002), pass))
		abort();

	VkMemoryBarrier2KHR memory_barrier2 =
			{ VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR };
	memory_barrier2.pNext = nullptr;
	memory_barrier2.srcStageMask = 10ull << 32;
	memory_barrier2.srcAccessMask = 34;
	memory_barrier2.dstStageMask = 199ull << 32;
	memory_barrier2.dstAccessMask = 49;
	deps[0].pNext = &memory_barrier2;

	if (!recorder.record_render_pass2(fake_handle<VkRenderPass>(40001), pass))
		abort();

	VkRenderPassCreationControlEXT creation_control =
			{ VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT };
	creation_control.disallowMerging = VK_TRUE;
	pass.pNext = &creation_control;
	if (!recorder.record_render_pass2(fake_handle<VkRenderPass>(40002), pass))
		abort();
}